

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::InitGoogleTestImpl<wchar_t>(int *argc,wchar_t **argv)

{
  int iVar1;
  UnitTestImpl *this;
  int i;
  ulong uVar2;
  wchar_t **streamable;
  bool bVar3;
  String local_40;
  
  iVar1 = g_init_gtest_count + 1;
  bVar3 = g_init_gtest_count == 0;
  g_init_gtest_count = iVar1;
  if ((bVar3) && (0 < *argc)) {
    StreamableToString<wchar_t*>((internal *)&local_40,argv);
    String::operator=((String *)g_executable_path,&local_40);
    String::~String(&local_40);
    std::vector<testing::internal::String,_std::allocator<testing::internal::String>_>::clear
              ((vector<testing::internal::String,_std::allocator<testing::internal::String>_> *)
               g_argvs);
    streamable = argv;
    for (uVar2 = 0; uVar2 != (uint)*argc; uVar2 = uVar2 + 1) {
      StreamableToString<wchar_t*>((internal *)&local_40,streamable);
      std::vector<testing::internal::String,_std::allocator<testing::internal::String>_>::
      emplace_back<testing::internal::String>
                ((vector<testing::internal::String,_std::allocator<testing::internal::String>_> *)
                 g_argvs,&local_40);
      String::~String(&local_40);
      streamable = streamable + 1;
    }
    ParseGoogleTestFlagsOnlyImpl<wchar_t>(argc,argv);
    this = GetUnitTestImpl();
    UnitTestImpl::PostFlagParsingInit(this);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  g_init_gtest_count++;

  // We don't want to run the initialization code twice.
  if (g_init_gtest_count != 1) return;

  if (*argc <= 0) return;

  internal::g_executable_path = internal::StreamableToString(argv[0]);

#if GTEST_HAS_DEATH_TEST

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

#endif  // GTEST_HAS_DEATH_TEST

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}